

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O0

UBool u_isxdigit_63(UChar32 c)

{
  uint uVar1;
  int iVar2;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  uint32_t props;
  UChar32 c_local;
  
  if ((((c < 0x67) && (0x40 < c)) && ((c < 0x47 || (0x60 < c)))) ||
     (((0xff20 < c && (c < 0xff47)) && ((c < 0xff27 || (0xff40 < c)))))) {
    props._3_1_ = true;
  }
  else {
    uVar1 = c >> 5;
    if ((uint)c < 0xd800) {
      local_24 = (uint)propsTrie_index[(int)uVar1] * 4 + (c & 0x1fU);
    }
    else {
      if ((uint)c < 0x10000) {
        iVar2 = 0;
        if (c < 0xdc00) {
          iVar2 = 0x140;
        }
        local_28 = (uint)propsTrie_index[(int)(iVar2 + uVar1)] * 4 + (c & 0x1fU);
      }
      else {
        if ((uint)c < 0x110000) {
          if (c < 0x110000) {
            local_30 = (uint)propsTrie_index
                             [(int)((uint)propsTrie_index[(c >> 0xb) + 0x820] + (uVar1 & 0x3f))] * 4
                       + (c & 0x1fU);
          }
          else {
            local_30 = 0x53c8;
          }
          local_2c = local_30;
        }
        else {
          local_2c = 0x11f4;
        }
        local_28 = local_2c;
      }
      local_24 = local_28;
    }
    props._3_1_ = (propsTrie_index[local_24] & 0x1f) == 9;
  }
  return props._3_1_;
}

Assistant:

U_CAPI UBool U_EXPORT2
u_isxdigit(UChar32 c) {
    uint32_t props;

    /* check ASCII and Fullwidth ASCII a-fA-F */
    if(
        (c<=0x66 && c>=0x41 && (c<=0x46 || c>=0x61)) ||
        (c>=0xff21 && c<=0xff46 && (c<=0xff26 || c>=0xff41))
    ) {
        return TRUE;
    }

    GET_PROPS(c, props);
    return (UBool)(GET_CATEGORY(props)==U_DECIMAL_DIGIT_NUMBER);
}